

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdpu383_com.c
# Opt level: O2

void vdpu383_setup_rcb(Vdpu383RegCommonAddr *reg,MppDev dev,MppBuffer buf,Vdpu383RcbInfo *info)

{
  RK_U32 RVar1;
  long lVar2;
  
  RVar1 = mpp_buffer_get_fd_with_caller(buf,"vdpu383_setup_rcb");
  reg->reg140_rcb_strmd_row_offset = RVar1;
  RVar1 = mpp_buffer_get_fd_with_caller(buf,"vdpu383_setup_rcb");
  reg->reg142_rcb_strmd_tile_row_offset = RVar1;
  RVar1 = mpp_buffer_get_fd_with_caller(buf,"vdpu383_setup_rcb");
  reg->reg144_rcb_inter_row_offset = RVar1;
  RVar1 = mpp_buffer_get_fd_with_caller(buf,"vdpu383_setup_rcb");
  reg->reg146_rcb_inter_tile_row_offset = RVar1;
  RVar1 = mpp_buffer_get_fd_with_caller(buf,"vdpu383_setup_rcb");
  reg->reg148_rcb_intra_row_offset = RVar1;
  RVar1 = mpp_buffer_get_fd_with_caller(buf,"vdpu383_setup_rcb");
  reg->reg150_rcb_intra_tile_row_offset = RVar1;
  RVar1 = mpp_buffer_get_fd_with_caller(buf,"vdpu383_setup_rcb");
  reg->reg152_rcb_filterd_row_offset = RVar1;
  RVar1 = mpp_buffer_get_fd_with_caller(buf,"vdpu383_setup_rcb");
  reg->reg154_rcb_filterd_protect_row_offset = RVar1;
  RVar1 = mpp_buffer_get_fd_with_caller(buf,"vdpu383_setup_rcb");
  reg->reg156_rcb_filterd_tile_row_offset = RVar1;
  RVar1 = mpp_buffer_get_fd_with_caller(buf,"vdpu383_setup_rcb");
  reg->reg158_rcb_filterd_tile_col_offset = RVar1;
  RVar1 = mpp_buffer_get_fd_with_caller(buf,"vdpu383_setup_rcb");
  reg->reg160_rcb_filterd_av1_upscale_tile_col_offset = RVar1;
  reg->reg141_rcb_strmd_row_len = info->size;
  reg->reg143_rcb_strmd_tile_row_len = info[1].size;
  reg->reg145_rcb_inter_row_len = info[2].size;
  reg->reg147_rcb_inter_tile_row_len = info[3].size;
  reg->reg149_rcb_intra_row_len = info[4].size;
  reg->reg151_rcb_intra_tile_row_len = info[5].size;
  reg->reg153_rcb_filterd_row_len = info[6].size;
  reg->reg155_rcb_filterd_protect_row_len = info[7].size;
  reg->reg157_rcb_filterd_tile_row_len = info[8].size;
  reg->reg159_rcb_filterd_tile_col_len = info[9].size;
  reg->reg161_rcb_filterd_av1_upscale_tile_col_len = info[10].size;
  for (lVar2 = 8; lVar2 != 0x8c; lVar2 = lVar2 + 0xc) {
    RVar1 = *(RK_U32 *)((long)&info->reg_idx + lVar2);
    if (RVar1 != 0) {
      mpp_dev_set_reg_offset(dev,*(RK_S32 *)((long)info + lVar2 + -8),RVar1);
    }
  }
  return;
}

Assistant:

void vdpu383_setup_rcb(Vdpu383RegCommonAddr *reg, MppDev dev,
                       MppBuffer buf, Vdpu383RcbInfo *info)
{
    RK_U32 i;

    reg->reg140_rcb_strmd_row_offset           = mpp_buffer_get_fd(buf);
    reg->reg142_rcb_strmd_tile_row_offset      = mpp_buffer_get_fd(buf);
    reg->reg144_rcb_inter_row_offset           = mpp_buffer_get_fd(buf);
    reg->reg146_rcb_inter_tile_row_offset      = mpp_buffer_get_fd(buf);
    reg->reg148_rcb_intra_row_offset           = mpp_buffer_get_fd(buf);
    reg->reg150_rcb_intra_tile_row_offset      = mpp_buffer_get_fd(buf);
    reg->reg152_rcb_filterd_row_offset         = mpp_buffer_get_fd(buf);
    reg->reg154_rcb_filterd_protect_row_offset = mpp_buffer_get_fd(buf);
    reg->reg156_rcb_filterd_tile_row_offset    = mpp_buffer_get_fd(buf);
    reg->reg158_rcb_filterd_tile_col_offset    = mpp_buffer_get_fd(buf);
    reg->reg160_rcb_filterd_av1_upscale_tile_col_offset = mpp_buffer_get_fd(buf);

    reg->reg141_rcb_strmd_row_len            =  info[RCB_STRMD_ROW].size          ;
    reg->reg143_rcb_strmd_tile_row_len       =  info[RCB_STRMD_TILE_ROW].size     ;
    reg->reg145_rcb_inter_row_len            =  info[RCB_INTER_ROW].size          ;
    reg->reg147_rcb_inter_tile_row_len       =  info[RCB_INTER_TILE_ROW].size     ;
    reg->reg149_rcb_intra_row_len            =  info[RCB_INTRA_ROW].size          ;
    reg->reg151_rcb_intra_tile_row_len       =  info[RCB_INTRA_TILE_ROW].size     ;
    reg->reg153_rcb_filterd_row_len          =  info[RCB_FILTERD_ROW].size        ;
    reg->reg155_rcb_filterd_protect_row_len  =  info[RCB_FILTERD_PROTECT_ROW].size;
    reg->reg157_rcb_filterd_tile_row_len     =  info[RCB_FILTERD_TILE_ROW].size   ;
    reg->reg159_rcb_filterd_tile_col_len     =  info[RCB_FILTERD_TILE_COL].size   ;
    reg->reg161_rcb_filterd_av1_upscale_tile_col_len = info[RCB_FILTERD_AV1_UP_TILE_COL].size;

    for (i = 0; i < RCB_BUF_COUNT; i++) {
        if (info[i].offset)
            mpp_dev_set_reg_offset(dev, info[i].reg_idx, info[i].offset);
    }
}